

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_promise_all_resolve_element
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                  JSValue *func_data)

{
  int *piVar1;
  JSValue new_target;
  JSValue errors;
  JSValue func_obj;
  JSValue func_obj_00;
  int iVar2;
  int iVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  JSAtom prop;
  JSValueUnion JVar6;
  char *buf;
  int64_t iVar7;
  int64_t iVar8;
  ulong uVar9;
  bool bVar10;
  JSValue resolve_element_env;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue prop_00;
  int index;
  JSValue values;
  uint uStack_94;
  uint local_7c;
  JSValueUnion local_78;
  int64_t iStack_70;
  JSValueUnion local_60;
  int64_t local_58;
  int64_t local_50;
  JSValueUnion local_48;
  JSValue local_40;
  
  JVar12 = *func_data;
  if (0xfffffff4 < (uint)func_data->tag) {
    *(int *)(func_data->u).ptr = *(func_data->u).ptr + 1;
  }
  iVar2 = JS_ToBoolFree(ctx,JVar12);
  local_78 = (JSValueUnion)func_data[2].u.ptr;
  iStack_70 = func_data[2].tag;
  local_60 = (JSValueUnion)func_data[3].u.ptr;
  local_58 = func_data[3].tag;
  local_48 = (JSValueUnion)func_data[4].u.ptr;
  local_50 = func_data[4].tag;
  piVar1 = (int *)func_data[1].u.ptr;
  JVar12 = func_data[1];
  if (0xfffffff4 < (uint)func_data[1].tag) {
    *piVar1 = *piVar1 + 1;
  }
  iVar3 = JS_ToInt32Free(ctx,(int32_t *)&local_7c,JVar12);
  iVar8 = 6;
  if (iVar3 == 0) {
    if (iVar2 != 0) {
LAB_0014b7e5:
      uVar9 = 0;
      uVar5 = 0;
      iVar8 = 3;
      goto LAB_0014b7f0;
    }
    (func_data->u).float64 = 4.94065645841247e-324;
    func_data->tag = 1;
    if ((magic & 3U) == 1) {
      JVar12 = JS_NewObjectProtoClass(ctx,ctx->class_proto[1],1);
      if ((uint)JVar12.tag != 6) {
        bVar10 = (magic & 4U) == 0;
        buf = "rejected";
        if (bVar10) {
          buf = "fulfilled";
        }
        JVar13 = JS_NewStringLen(ctx,buf,(ulong)bVar10 | 8);
        if (((int)JVar13.tag != 6) &&
           (iVar2 = JS_DefinePropertyValue(ctx,JVar12,0x88,JVar13,7), -1 < iVar2)) {
          prop = 0x89;
          if ((magic & 4U) == 0) {
            prop = 0x40;
          }
          JVar13 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          iVar2 = JS_DefinePropertyValue(ctx,JVar12,prop,JVar13,7);
          if (-1 < iVar2) goto LAB_0014b912;
        }
        if ((0xfffffff4 < (uint)JVar12.tag) &&
           (iVar2 = *JVar12.u.ptr, *(int *)JVar12.u.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar12);
        }
      }
    }
    else {
      JVar13 = *argv;
      JVar12 = *argv;
      if (0xfffffff4 < (uint)argv->tag) {
        *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
        JVar12 = JVar13;
      }
LAB_0014b912:
      JVar4 = (JSValueUnion)(long)(int)local_7c;
      JVar13.tag = iStack_70;
      JVar13.u.ptr = local_78.ptr;
      JVar6.float64 = (double)local_7c;
      if (-1 < (long)JVar4.ptr) {
        JVar6 = JVar4;
      }
      iVar7 = 7;
      if (-1 < (long)JVar4.ptr) {
        iVar7 = 0;
      }
      prop_00.tag = iVar7;
      prop_00.u.float64 = JVar6.float64;
      iVar2 = JS_DefinePropertyValueValue(ctx,JVar13,prop_00,JVar12,7);
      if (-1 < iVar2) {
        resolve_element_env.tag = local_50;
        resolve_element_env.u.float64 = local_48.float64;
        iVar2 = remainingElementsCount_add(ctx,resolve_element_env,-1);
        if (-1 < iVar2) {
          if (iVar2 == 0) goto LAB_0014b7e5;
          uStack_94 = JVar12.u._4_4_;
          if ((magic & 3U) == 2) {
            errors.tag = iStack_70;
            errors.u.ptr = local_78.ptr;
            local_40 = js_aggregate_error_constructor(ctx,errors);
            if ((int)local_40.tag == 6) goto LAB_0014b7dd;
            func_obj.tag = local_58;
            func_obj.u.ptr = local_60.ptr;
            new_target.tag = 3;
            new_target.u.ptr = (void *)((ulong)uStack_94 << 0x20);
            JVar12 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),new_target,1,
                                     &local_40,2);
            JS_FreeValue(ctx,local_40);
          }
          else {
            func_obj_00.tag = local_58;
            func_obj_00.u.ptr = local_60.ptr;
            JVar12.tag = 3;
            JVar12.u.ptr = (void *)((ulong)uStack_94 << 0x20);
            JVar12 = JS_CallInternal(ctx,func_obj_00,(JSValue)(ZEXT816(3) << 0x40),JVar12,1,
                                     (JSValue *)&local_78,2);
          }
          iVar8 = JVar12.tag;
          if ((int)JVar12.tag == 6) {
            uVar5 = (ulong)JVar12.u.ptr & 0xffffffff00000000;
            uVar9 = (ulong)JVar12.u.ptr & 0xffffffff;
            goto LAB_0014b7f0;
          }
          JS_FreeValue(ctx,JVar12);
          goto LAB_0014b7e5;
        }
      }
    }
  }
LAB_0014b7dd:
  uVar9 = 0;
  uVar5 = 0;
LAB_0014b7f0:
  JVar11.tag = iVar8;
  JVar11.u.ptr = (void *)(uVar9 | uVar5);
  return JVar11;
}

Assistant:

static JSValue js_promise_all_resolve_element(JSContext *ctx,
                                              JSValueConst this_val,
                                              int argc, JSValueConst *argv,
                                              int magic,
                                              JSValue *func_data)
{
    int resolve_type = magic & 3;
    int is_reject = magic & 4;
    BOOL alreadyCalled = JS_ToBool(ctx, func_data[0]);
    JSValueConst values = func_data[2];
    JSValueConst resolve = func_data[3];
    JSValueConst resolve_element_env = func_data[4];
    JSValue ret, obj;
    int is_zero, index;
    
    if (JS_ToInt32(ctx, &index, func_data[1]))
        return JS_EXCEPTION;
    if (alreadyCalled)
        return JS_UNDEFINED;
    func_data[0] = JS_NewBool(ctx, TRUE);

    if (resolve_type == PROMISE_MAGIC_allSettled) {
        JSValue str;
        
        obj = JS_NewObject(ctx);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        str = JS_NewString(ctx, is_reject ? "rejected" : "fulfilled");
        if (JS_IsException(str))
            goto fail1;
        if (JS_DefinePropertyValue(ctx, obj, JS_ATOM_status,
                                   str,
                                   JS_PROP_C_W_E) < 0)
            goto fail1;
        if (JS_DefinePropertyValue(ctx, obj,
                                   is_reject ? JS_ATOM_reason : JS_ATOM_value,
                                   JS_DupValue(ctx, argv[0]),
                                   JS_PROP_C_W_E) < 0) {
        fail1:
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    } else {
        obj = JS_DupValue(ctx, argv[0]);
    }
    if (JS_DefinePropertyValueUint32(ctx, values, index,
                                     obj, JS_PROP_C_W_E) < 0)
        return JS_EXCEPTION;
    
    is_zero = remainingElementsCount_add(ctx, resolve_element_env, -1);
    if (is_zero < 0)
        return JS_EXCEPTION;
    if (is_zero) {
        if (resolve_type == PROMISE_MAGIC_any) {
            JSValue error;
            error = js_aggregate_error_constructor(ctx, values);
            if (JS_IsException(error))
                return JS_EXCEPTION;
            ret = JS_Call(ctx, resolve, JS_UNDEFINED, 1, (JSValueConst *)&error);
            JS_FreeValue(ctx, error);
        } else {
            ret = JS_Call(ctx, resolve, JS_UNDEFINED, 1, (JSValueConst *)&values);
        }
        if (JS_IsException(ret))
            return ret;
        JS_FreeValue(ctx, ret);
    }
    return JS_UNDEFINED;
}